

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  pointer pcVar1;
  text *ptVar2;
  undefined1 uVar3;
  int iVar4;
  undefined8 uVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined1 uVar8;
  pointer pbVar9;
  seed_t sVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  _Alloc_hider _Var13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  bool bVar21;
  undefined1 uVar22;
  text opt;
  text val;
  text arg;
  texts in;
  int local_224;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  undefined8 local_1e0;
  undefined8 local_1d8;
  ulong local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  seed_t local_188;
  undefined8 local_180;
  value_type local_178;
  text local_158;
  text local_138;
  text local_118;
  text local_f8;
  text local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  texts *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var;
  
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = args;
  if (pbVar9 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_224 = 1;
    uVar14 = false;
    uVar3 = false;
    uVar20 = false;
    uVar12 = false;
    uVar8 = false;
    uVar11 = false;
    uVar15 = false;
    sVar10 = 0;
    uVar16 = false;
    uVar17 = false;
    uVar22 = false;
    uVar18 = false;
    uVar19 = false;
  }
  else {
    local_224 = 1;
    bVar21 = true;
    local_1a0 = 0;
    local_1a8 = 0;
    local_1b0 = 0;
    local_1c0 = 0;
    local_1b8 = 0;
    local_188 = 0;
    local_180 = 0;
    local_1e0 = 0;
    local_198 = 0;
    local_190 = 0;
    local_1d8 = 0;
    local_1d0 = 0;
    local_1c8 = 0;
    do {
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      local_220._M_string_length = 0;
      local_220.field_2._M_local_buf[0] = '\0';
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      local_200._M_string_length = 0;
      local_200.field_2._M_local_buf[0] = '\0';
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      pcVar1 = (pbVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_178,pcVar1,pcVar1 + pbVar9->_M_string_length);
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d8,local_178._M_dataplus._M_p,
                 local_178._M_dataplus._M_p + local_178._M_string_length);
      split_option(&local_b8,&local_d8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_220,&local_b8.first);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_200,&local_b8.second);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.second._M_dataplus._M_p != &local_b8.second.field_2) {
        operator_delete(local_b8.second._M_dataplus._M_p,
                        local_b8.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.first._M_dataplus._M_p != &local_b8.first.field_2) {
        operator_delete(local_b8.first._M_dataplus._M_p,
                        local_b8.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((bVar21) && (*local_220._M_dataplus._M_p == '-')) {
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_220,"--");
        if (iVar4 == 0) goto LAB_00104637;
        iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_220,"-h");
        uVar5 = CONCAT44(extraout_var,iVar4);
        if (iVar4 == 0) {
LAB_001046b2:
          local_1a0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
LAB_001046ec:
          bVar21 = true;
        }
        else {
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"--help");
          uVar5 = CONCAT44(extraout_var_00,iVar4);
          if (iVar4 == 0) goto LAB_001046b2;
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"-a");
          uVar5 = CONCAT44(extraout_var_01,iVar4);
          if (iVar4 == 0) {
LAB_001046be:
            local_1a8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001046ec;
          }
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"--abort");
          uVar5 = CONCAT44(extraout_var_02,iVar4);
          if (iVar4 == 0) goto LAB_001046be;
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"-c");
          uVar5 = CONCAT44(extraout_var_03,iVar4);
          if (iVar4 == 0) {
LAB_001046ca:
            local_1b0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001046ec;
          }
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"--count");
          uVar5 = CONCAT44(extraout_var_04,iVar4);
          if (iVar4 == 0) goto LAB_001046ca;
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"-g");
          uVar5 = CONCAT44(extraout_var_05,iVar4);
          if (iVar4 == 0) {
LAB_001046d3:
            local_1b8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001046ec;
          }
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"--list-tags");
          uVar5 = CONCAT44(extraout_var_06,iVar4);
          if (iVar4 == 0) goto LAB_001046d3;
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"-l");
          uVar5 = CONCAT44(extraout_var_07,iVar4);
          if (iVar4 == 0) {
LAB_001046dc:
            local_1c0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001046ec;
          }
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"--list-tests");
          uVar5 = CONCAT44(extraout_var_08,iVar4);
          if (iVar4 == 0) goto LAB_001046dc;
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"-t");
          uVar5 = CONCAT44(extraout_var_09,iVar4);
          if (iVar4 == 0) {
LAB_001046e5:
            local_1c8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001046ec;
          }
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"--time");
          uVar5 = CONCAT44(extraout_var_10,iVar4);
          if (iVar4 == 0) goto LAB_001046e5;
          iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_220,"-p");
          uVar5 = CONCAT44(extraout_var_11,iVar4);
          bVar21 = true;
          if (iVar4 != 0) {
            iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_220,"--pass");
            uVar5 = CONCAT44(extraout_var_12,iVar4);
            if (iVar4 == 0) goto LAB_001046f4;
            iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_220,"-z");
            uVar5 = CONCAT44(extraout_var_13,iVar4);
            if (iVar4 != 0) {
              iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_220,"--pass-zen");
              uVar5 = CONCAT44(extraout_var_14,iVar4);
              if (iVar4 == 0) goto LAB_00104700;
              iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_220,"-v");
              uVar5 = CONCAT44(extraout_var_15,iVar4);
              if (iVar4 == 0) {
LAB_00104709:
                local_1e0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
                goto LAB_001046ec;
              }
              iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_220,"--verbose");
              uVar5 = CONCAT44(extraout_var_16,iVar4);
              if (iVar4 == 0) goto LAB_00104709;
              iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (&local_220,"--version");
              if (iVar4 == 0) {
                local_180 = CONCAT71((int7)(CONCAT44(extraout_var_17,iVar4) >> 8),1);
              }
              else {
                iVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                  (&local_220,"--order");
                if ((iVar4 != 0) ||
                   (iVar4 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_200,"declared"), iVar4 != 0)) {
                  iVar4 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_220,"--order");
                  if (iVar4 == 0) {
                    iVar4 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_200,"lexical");
                    if (iVar4 == 0) {
                      local_190 = CONCAT71((int7)(CONCAT44(extraout_var_18,iVar4) >> 8),1);
                      goto LAB_001047f6;
                    }
                  }
                  iVar4 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_220,"--order");
                  if (iVar4 == 0) {
                    iVar4 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_200,"random");
                    if (iVar4 == 0) {
                      local_198 = CONCAT71((int7)(CONCAT44(extraout_var_19,iVar4) >> 8),1);
                      goto LAB_001047f6;
                    }
                  }
                  iVar4 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                    (&local_220,"--random-seed");
                  if (iVar4 == 0) {
                    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_f8,"--random-seed","");
                    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_138,local_200._M_dataplus._M_p,
                               local_200._M_dataplus._M_p + local_200._M_string_length);
                    local_188 = seed(&local_f8,&local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_138._M_dataplus._M_p != &local_138.field_2) {
                      operator_delete(local_138._M_dataplus._M_p,
                                      local_138.field_2._M_allocated_capacity + 1);
                    }
                    ptVar2 = &local_f8;
                    _Var13._M_p = local_f8._M_dataplus._M_p;
                  }
                  else {
                    iVar4 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                            compare(&local_220,"--repeat");
                    if (iVar4 != 0) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+(&local_50,"unrecognised option \'",&local_220);
                      pbVar6 = std::__cxx11::
                               basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                               append(&local_50,"\' (try option --help)");
                      local_b8.first._M_dataplus._M_p = (pbVar6->_M_dataplus)._M_p;
                      paVar7 = &pbVar6->field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b8.first._M_dataplus._M_p == paVar7) {
                        local_b8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity
                        ;
                        local_b8.first.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
                        local_b8.first._M_dataplus._M_p = (pointer)&local_b8.first.field_2;
                      }
                      else {
                        local_b8.first.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity
                        ;
                      }
                      local_b8.first._M_string_length = pbVar6->_M_string_length;
                      (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
                      pbVar6->_M_string_length = 0;
                      (pbVar6->field_2)._M_local_buf[0] = '\0';
                      std::runtime_error::runtime_error(this,(string *)&local_b8);
                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_118,"--repeat","");
                    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_158,local_200._M_dataplus._M_p,
                               local_200._M_dataplus._M_p + local_200._M_string_length);
                    local_224 = repeat(&local_118,&local_158);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_158._M_dataplus._M_p != &local_158.field_2) {
                      operator_delete(local_158._M_dataplus._M_p,
                                      local_158.field_2._M_allocated_capacity + 1);
                    }
                    ptVar2 = &local_118;
                    _Var13._M_p = local_118._M_dataplus._M_p;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var13._M_p != &ptVar2->field_2) {
                    operator_delete(_Var13._M_p,(ptVar2->field_2)._M_allocated_capacity + 1);
                  }
                }
              }
LAB_001047f6:
              bVar21 = true;
              goto LAB_0010463a;
            }
LAB_00104700:
            local_1d8 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
            goto LAB_001046ec;
          }
LAB_001046f4:
          local_1d0 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_78,&local_178);
LAB_00104637:
        bVar21 = false;
      }
LAB_0010463a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,
                        CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                                 local_200.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,
                        CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                 local_220.field_2._M_local_buf[0]) + 1);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != (local_58->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    uVar20 = (undefined1)local_1d8;
    uVar3 = 1;
    if ((local_1d0 & 1) == 0) {
      uVar3 = uVar20;
    }
    uVar8 = (undefined1)local_198;
    uVar11 = (undefined1)local_1e0;
    uVar12 = (undefined1)local_190;
    uVar14 = (undefined1)local_1c8;
    uVar15 = (undefined1)local_180;
    uVar16 = (undefined1)local_1b8;
    uVar17 = (undefined1)local_1c0;
    uVar22 = (undefined1)local_1b0;
    uVar18 = (undefined1)local_1a8;
    uVar19 = (undefined1)local_1a0;
    sVar10 = local_188;
  }
  (__return_storage_ptr__->first).help = (bool)uVar19;
  (__return_storage_ptr__->first).abort = (bool)uVar18;
  (__return_storage_ptr__->first).count = (bool)uVar22;
  (__return_storage_ptr__->first).list = (bool)uVar17;
  (__return_storage_ptr__->first).tags = (bool)uVar16;
  (__return_storage_ptr__->first).time = (bool)uVar14;
  (__return_storage_ptr__->first).pass = (bool)uVar3;
  (__return_storage_ptr__->first).zen = (bool)uVar20;
  (__return_storage_ptr__->first).lexical = (bool)uVar12;
  (__return_storage_ptr__->first).random = (bool)uVar8;
  (__return_storage_ptr__->first).verbose = (bool)uVar11;
  (__return_storage_ptr__->first).version = (bool)uVar15;
  (__return_storage_ptr__->first).repeat = local_224;
  (__return_storage_ptr__->first).seed = sVar10;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&__return_storage_ptr__->second,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}